

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void NULLCIO::ReadString(char *buf,uint length)

{
  int iVar1;
  long lVar2;
  char ch;
  char local_19;
  
  if (length != 0) {
    *buf = '\0';
    local_19 = '\0';
    lVar2 = (ulong)length - 1;
    do {
      iVar1 = (*readFunc)(contextFunc,&local_19,1);
      if ((iVar1 == 0) || (local_19 == '\n')) break;
      *buf = local_19;
      buf = buf + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    *buf = '\0';
  }
  return;
}

Assistant:

void ReadString(char *buf, unsigned length)
	{
		if(!length)
			return;

		*buf = 0;

		char *pos = buf;
		char ch = 0;

		while(readFunc(contextFunc, &ch, 1))
		{
			if(ch == '\n')
				break;

			*pos++ = ch;

			if(pos + 1 == buf + length)
				break;
		}

		*pos = 0;
	}